

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O3

bool __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::retrieve_symbol_walk
          (dwarf_resolver *this,die_object *cu_die,die_object *die,Dwarf_Addr pc,
          Dwarf_Half dwversion,stacktrace_frame *frame,
          vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *inlines)

{
  undefined1 local_59;
  die_object *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_59 = 0;
  local_50._8_8_ = 0;
  local_58 = die;
  local_50._M_unused._M_object = operator_new(0x38);
  *(dwarf_resolver **)local_50._M_unused._0_8_ = this;
  *(die_object **)((long)local_50._M_unused._0_8_ + 8) = cu_die;
  *(Dwarf_Addr *)((long)local_50._M_unused._0_8_ + 0x10) = pc;
  *(Dwarf_Half *)((long)local_50._M_unused._0_8_ + 0x18) = dwversion;
  *(stacktrace_frame **)((long)local_50._M_unused._0_8_ + 0x20) = frame;
  *(vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> **)
   ((long)local_50._M_unused._0_8_ + 0x28) = inlines;
  *(undefined1 **)((long)local_50._M_unused._0_8_ + 0x30) = &local_59;
  local_38 = std::
             _Function_handler<bool_(const_cpptrace::detail::libdwarf::die_object_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp:474:17)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<bool_(const_cpptrace::detail::libdwarf::die_object_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp:474:17)>
             ::_M_manager;
  walk_die_list(local_58,(function<bool_(const_cpptrace::detail::libdwarf::die_object_&)> *)
                         &local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return (bool)local_59;
}

Assistant:

CPPTRACE_FORCE_NO_INLINE_FOR_PROFILING
        bool retrieve_symbol_walk(
            const die_object& cu_die,
            const die_object& die,
            Dwarf_Addr pc,
            Dwarf_Half dwversion,
            stacktrace_frame& frame,
            std::vector<stacktrace_frame>& inlines
        ) {
            bool found = false;
            walk_die_list(
                die,
                [this, &cu_die, pc, dwversion, &frame, &inlines, &found] (const die_object& die) {
                    if(dump_dwarf) {
                        std::fprintf(
                            stderr,
                            "-------------> %08llx %s %s\n",
                            to_ull(die.get_global_offset()),
                            die.get_tag_name(),
                            die.get_name().c_str()
                        );
                    }
                    if(!(die.get_tag() == DW_TAG_namespace || die.pc_in_die(cu_die, dwversion, pc))) {
                        if(dump_dwarf) {
                            std::fprintf(stderr, "pc not in die\n");
                        }
                    } else {
                        if(trace_dwarf) {
                            std::fprintf(
                                stderr,
                                "%s %08llx %s\n",
                                die.get_tag() == DW_TAG_namespace ? "pc maybe in die (namespace)" : "pc in die",
                                to_ull(die.get_global_offset()),
                                die.get_tag_name()
                            );
                        }
                        if(die.get_tag() == DW_TAG_subprogram) {
                            frame.symbol = retrieve_symbol_for_subprogram(cu_die, die, pc, dwversion, inlines);
                            found = true;
                            return false;
                        }
                        auto child = die.get_child();
                        if(child) {
                            if(retrieve_symbol_walk(cu_die, child, pc, dwversion, frame, inlines)) {
                                found = true;
                                return false;
                            }
                        } else {
                            if(dump_dwarf) {
                                std::fprintf(stderr, "(no child)\n");
                            }
                        }
                    }
                    return true;
                }
            );
            if(dump_dwarf) {
                std::fprintf(stderr, "End walk_die_list\n");
            }
            return found;
        }